

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_rshift_safe_in_place(mp_int *r,size_t bits)

{
  ulong uVar1;
  byte bVar2;
  BignumInt BVar3;
  BignumInt w_1;
  size_t i_1;
  BignumInt mask_1;
  uint upshift;
  uint shift;
  uint bit_1;
  BignumInt w;
  size_t i;
  BignumInt mask;
  size_t word_offset;
  uint bit;
  uint clear;
  size_t bitshift;
  size_t wordshift;
  size_t bits_local;
  mp_int *r_local;
  
  mp_cond_clear(r,(uint)(r->nw - (bits >> 6) >> 0x3f));
  for (bVar2 = 0; r->nw >> (bVar2 & 0x3f) != 0; bVar2 = bVar2 + 1) {
    for (w = 0; w < r->nw; w = w + 1) {
      BVar3 = mp_word(r,w + (1L << (bVar2 & 0x3f)));
      r->w[w] = (r->w[w] ^ BVar3) & -((bits >> 6) >> (bVar2 & 0x3f) & 1) ^ r->w[w];
    }
  }
  for (upshift = 0; upshift < 6; upshift = upshift + 1) {
    bVar2 = (byte)(1 << ((byte)upshift & 0x1f));
    for (w_1 = 0; w_1 < r->nw; w_1 = w_1 + 1) {
      uVar1 = r->w[w_1];
      BVar3 = mp_word(r,w_1 + 1);
      r->w[w_1] = (r->w[w_1] ^ (uVar1 >> (bVar2 & 0x3f) | BVar3 << (0x40 - bVar2 & 0x3f))) &
                  -((bits & 0x3f) >> ((byte)upshift & 0x3f) & 1) ^ r->w[w_1];
    }
  }
  return;
}

Assistant:

static void mp_rshift_safe_in_place(mp_int *r, size_t bits)
{
    size_t wordshift = bits / BIGNUM_INT_BITS;
    size_t bitshift = bits % BIGNUM_INT_BITS;

    unsigned clear = (r->nw - wordshift) >> (CHAR_BIT * sizeof(size_t) - 1);
    mp_cond_clear(r, clear);

    for (unsigned bit = 0; r->nw >> bit; bit++) {
        size_t word_offset = (size_t)1 << bit;
        BignumInt mask = -(BignumInt)((wordshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = mp_word(r, i + word_offset);
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }

    /*
     * That's done the shifting by words; now we do the shifting by
     * bits.
     */
    for (unsigned bit = 0; bit < BIGNUM_INT_BITS_BITS; bit++) {
        unsigned shift = 1 << bit, upshift = BIGNUM_INT_BITS - shift;
        BignumInt mask = -(BignumInt)((bitshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = ((r->w[i] >> shift) | (mp_word(r, i+1) << upshift));
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }
}